

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O3

JavascriptString * Js::DateImplementation::GetDateGmtString(YMD *pymd,ScriptContext *scriptContext)

{
  int iVar1;
  CompoundString *toString;
  YMD *pYVar2;
  int local_2c;
  short local_28;
  undefined2 local_26;
  int positiveYear;
  
  toString = CompoundString::NewWithCharCapacity
                       (0x1e,(scriptContext->super_ScriptContextBase).javascriptLibrary);
  CompoundString::AppendGeneric<4u,Js::CompoundString>
            ((char16 (*) [4])(g_rgpszDay + (long)pymd->wday * 8),true,toString,true);
  CompoundString::AppendGeneric<3u,Js::CompoundString>((char16 (*) [3])0x10217e8,true,toString,true)
  ;
  local_28 = (short)pymd->mday + 1;
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
            (toString);
  CompoundString::AppendChars(toString,L' ');
  CompoundString::AppendGeneric<4u,Js::CompoundString>
            ((char16 (*) [4])(g_rgpszMonth + (long)pymd->mon * 8),true,toString,true);
  CompoundString::AppendChars(toString,L' ');
  pYVar2 = pymd;
  if (pymd->year < 1) {
    local_2c = -pymd->year;
    CompoundString::AppendChars(toString,L'-');
    pYVar2 = (YMD *)&local_2c;
  }
  CompoundString::AppendChars<int,Js::__4>(toString,pYVar2);
  CompoundString::AppendChars(toString,L' ');
  local_26 = (undefined2)(pymd->time / 3600000);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
            (toString);
  CompoundString::AppendChars(toString,L':');
  iVar1 = pymd->time / 60000;
  positiveYear._0_2_ =
       (short)iVar1 +
       ((short)(uint)((ulong)((long)iVar1 * 0x88888889) >> 0x25) - (short)(iVar1 >> 0x1f)) * -0x3c;
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
            (toString);
  CompoundString::AppendChars(toString,L':');
  iVar1 = pymd->time / 1000;
  positiveYear._2_2_ =
       (short)iVar1 +
       ((short)(uint)((ulong)((long)iVar1 * 0x88888889) >> 0x25) - (short)(iVar1 >> 0x1f)) * -0x3c;
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
            (toString);
  CompoundString::AppendChars(toString,L' ');
  CompoundString::AppendGeneric<4u,Js::CompoundString>((char16 (*) [4])0x1129bae,true,toString,true)
  ;
  return (JavascriptString *)toString;
}

Assistant:

JavascriptString*
    DateImplementation::GetDateGmtString(DateTime::YMD *pymd,ScriptContext* scriptContext)
    {
        // toUTCString() or toGMTString() will return for example:
        //  "Thu, 02 Feb 2012 09:02:03 GMT" for versions IE11 or above

        CompoundString *const bs = CompoundString::NewWithCharCapacity(30, scriptContext->GetLibrary());

        const auto ConvertUInt16ToString_ZeroPad_2 = [](const uint16 value, char16 *const buffer, const CharCount charCapacity)
        {
            const charcount_t cchWritten = NumberUtilities::UInt16ToString(value, buffer, charCapacity, 2);
            Assert(cchWritten != 0);
        };
        const auto ConvertLongToString = [](const int32 value, char16 *const buffer, const CharCount charCapacity)
        {
            const errno_t err = _ltow_s(value, buffer, charCapacity, 10);
            Assert(err == 0);
        };

        bs->AppendChars(g_rgpszDay[pymd->wday]);
        bs->AppendChars(_u(", "));
        // sz - as %02d - output is "01" to "31"
        bs->AppendChars(static_cast<WORD>(pymd->mday + 1), 2, ConvertUInt16ToString_ZeroPad_2);
        bs->AppendChars(_u(' '));
        bs->AppendChars(g_rgpszMonth[pymd->mon]);
        bs->AppendChars(_u(' '));

        // Add the year.
        if ((pymd->year) > 0)
        {
            bs->AppendChars(pymd->year, 10, ConvertUInt32ToString_ZeroPad_4);
        }
        else
        {
            int positiveYear = -(pymd->year); // pymd->year is negative
            bs->AppendChars(_u('-'));
            bs->AppendChars(positiveYear, 10, ConvertUInt32ToString_ZeroPad_4);
        }

        // Add the time.
        bs->AppendChars(_u(' '));
        // sz - as %02d - HOUR
        bs->AppendChars(static_cast<WORD>(pymd->time / 3600000), 2, ConvertUInt16ToString_ZeroPad_2);
        bs->AppendChars(_u(':'));
        // sz - as %02d - MINUTE
        bs->AppendChars(static_cast<WORD>((pymd->time / 60000) % 60), 2, ConvertUInt16ToString_ZeroPad_2);
        bs->AppendChars(_u(':'));
        // sz - as %02d - SECOND
        bs->AppendChars(static_cast<WORD>((pymd->time / 1000) % 60), 2, ConvertUInt16ToString_ZeroPad_2);
        bs->AppendChars(_u(' '));

        bs->AppendChars(_u("GMT"));

        return bs;
    }